

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_control.c
# Opt level: O0

void * INT_CMCondition_get_client_data(CManager cm,int condition)

{
  CMCondition p_Var1;
  long in_RDI;
  CMControlList cl;
  void *client_data;
  CMCondition cond;
  int condition_00;
  CMControlList in_stack_ffffffffffffffd8;
  void *local_8;
  
  condition_00 = (int)((ulong)*(undefined8 *)(in_RDI + 0x20) >> 0x20);
  set_debug_flag((CManager)0x12a425);
  p_Var1 = CMCondition_find(in_stack_ffffffffffffffd8,condition_00);
  if (p_Var1 == (CMCondition)0x0) {
    local_8 = (void *)0x0;
  }
  else {
    local_8 = p_Var1->client_data;
  }
  return local_8;
}

Assistant:

extern void *
INT_CMCondition_get_client_data(CManager cm, int condition)
{
    CMCondition cond;
    void *client_data;
    CMControlList cl = cm->control_list;
    set_debug_flag(cm);
    cond = CMCondition_find(cl, condition);
    if (cond) {
	client_data = cond->client_data;
	return client_data;
    } else {
	return NULL;
    }
}